

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O2

REF_STATUS
mask_strong_bc_adjoint
          (REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,REF_INT ldim,REF_DBL *prim_dual)

{
  uint uVar1;
  REF_BOOL *replace;
  undefined8 uVar2;
  char *pcVar3;
  
  uVar1 = ref_grid->node->max * ldim;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xbaa,"mask_strong_bc_adjoint","malloc replace of REF_BOOL negative");
    uVar1 = 1;
  }
  else {
    replace = (REF_BOOL *)malloc((ulong)uVar1 << 2);
    if (replace == (REF_BOOL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xbaa,"mask_strong_bc_adjoint","malloc replace of REF_BOOL NULL");
      uVar1 = 2;
    }
    else {
      uVar1 = ref_phys_mask_strong_bcs(ref_grid,ref_dict_bcs,replace,ldim);
      if (uVar1 == 0) {
        uVar1 = ref_recon_extrapolate_kexact(ref_grid,prim_dual,replace,ldim);
        if (uVar1 == 0) {
          free(replace);
          return 0;
        }
        pcVar3 = "extrapolate kexact";
        uVar2 = 0xbad;
      }
      else {
        pcVar3 = "mask";
        uVar2 = 0xbab;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar2,"mask_strong_bc_adjoint",(ulong)uVar1,pcVar3);
    }
  }
  return uVar1;
}

Assistant:

static REF_STATUS mask_strong_bc_adjoint(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs, REF_INT ldim,
                                         REF_DBL *prim_dual) {
  REF_BOOL *replace;
  ref_malloc(replace, ldim * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
  RSS(ref_phys_mask_strong_bcs(ref_grid, ref_dict_bcs, replace, ldim), "mask");
  RSS(ref_recon_extrapolate_kexact(ref_grid, prim_dual, replace, ldim),
      "extrapolate kexact");
  ref_free(replace);

  return REF_SUCCESS;
}